

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13InvalidRFC822nameConstraintsTest22<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section13InvalidRFC822nameConstraintsTest22
          (Section13InvalidRFC822nameConstraintsTest22<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section13InvalidRFC822nameConstraintsTest22<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section13InvalidRFC822nameConstraintsTest22(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13InvalidRFC822nameConstraintsTest22) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsRFC822CA1Cert",
                               "InvalidRFC822nameConstraintsTest22EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "nameConstraintsRFC822CA1CRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.22";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}